

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O3

void __thiscall ktx::OptionsEncodeBasis<true>::OptionsEncodeBasis(OptionsEncodeBasis<true> *this)

{
  int iVar1;
  
  (this->qualityLevel).option = &(this->super_ktxBasisParams).qualityLevel;
  (this->qualityLevel).min = 1;
  (this->qualityLevel).max = 0xff;
  (this->maxEndpoints).option = &(this->super_ktxBasisParams).maxEndpoints;
  (this->maxEndpoints).min = 1;
  (this->maxEndpoints).max = 0x3f00;
  (this->maxSelectors).option = &(this->super_ktxBasisParams).maxSelectors;
  (this->maxSelectors).min = 1;
  (this->maxSelectors).max = 0x3f00;
  (this->uastcRDODictSize).option = &(this->super_ktxBasisParams).uastcRDODictSize;
  (this->uastcRDODictSize).min = 0x100;
  (this->uastcRDODictSize).max = 0x10000;
  (this->uastcRDOQualityScalar).option = &(this->super_ktxBasisParams).uastcRDOQualityScalar;
  (this->uastcRDOQualityScalar).min = 0.001;
  (this->uastcRDOQualityScalar).max = 50.0;
  (this->uastcRDOMaxSmoothBlockErrorScale).option =
       &(this->super_ktxBasisParams).uastcRDOMaxSmoothBlockErrorScale;
  (this->uastcRDOMaxSmoothBlockErrorScale).min = 1.0;
  (this->uastcRDOMaxSmoothBlockErrorScale).max = 300.0;
  (this->uastcRDOMaxSmoothBlockStdDev).option =
       &(this->super_ktxBasisParams).uastcRDOMaxSmoothBlockStdDev;
  (this->uastcRDOMaxSmoothBlockStdDev).min = 0.01;
  (this->uastcRDOMaxSmoothBlockStdDev).max = 65536.0;
  (this->codecOptions)._M_dataplus._M_p = (pointer)&(this->codecOptions).field_2;
  (this->codecOptions)._M_string_length = 0;
  (this->codecOptions).field_2._M_local_buf[0] = '\0';
  (this->codecName)._M_dataplus._M_p = (pointer)&(this->codecName).field_2;
  (this->codecName)._M_string_length = 0;
  (this->codecName).field_2._M_local_buf[0] = '\0';
  iVar1 = std::thread::hardware_concurrency();
  (this->super_ktxBasisParams).threadCount = iVar1 + (uint)(iVar1 == 0);
  (this->super_ktxBasisParams).noSSE = false;
  (this->super_ktxBasisParams).structSize = 0x4c;
  (this->super_ktxBasisParams).compressionLevel = _KTX_ETC1S_DEFAULT_COMPRESSION_LEVEL - 1;
  *(this->qualityLevel).option = 0;
  *(this->maxEndpoints).option = 0;
  (this->super_ktxBasisParams).endpointRDOThreshold = 0.0;
  *(this->maxSelectors).option = 0;
  (this->super_ktxBasisParams).selectorRDOThreshold = 0.0;
  (this->super_ktxBasisParams).uastc = false;
  (this->super_ktxBasisParams).uastcRDO = false;
  (this->super_ktxBasisParams).normalMap = false;
  (this->super_ktxBasisParams).separateRGToRGB_A = false;
  (this->super_ktxBasisParams).preSwizzle = false;
  (this->super_ktxBasisParams).noEndpointRDO = false;
  (this->super_ktxBasisParams).noSelectorRDO = false;
  (this->super_ktxBasisParams).uastcFlags = 2;
  *(this->uastcRDODictSize).option = 0;
  *(this->uastcRDOQualityScalar).option = 0.0;
  (this->super_ktxBasisParams).uastcRDODontFavorSimplerModes = false;
  (this->super_ktxBasisParams).uastcRDONoMultithreading = false;
  (this->super_ktxBasisParams).verbose = false;
  (this->super_ktxBasisParams).inputSwizzle[0] = '\0';
  (this->super_ktxBasisParams).inputSwizzle[1] = '\0';
  (this->super_ktxBasisParams).inputSwizzle[2] = '\0';
  (this->super_ktxBasisParams).inputSwizzle[3] = '\0';
  return;
}

Assistant:

OptionsEncodeBasis() :
        qualityLevel(ktxBasisParams::qualityLevel, 1, 255),
        maxEndpoints(ktxBasisParams::maxEndpoints, 1, 16128),
        maxSelectors(ktxBasisParams::maxSelectors, 1, 16128),
        uastcRDODictSize(ktxBasisParams::uastcRDODictSize, 256, 65536),
        uastcRDOQualityScalar(ktxBasisParams::uastcRDOQualityScalar,
                              0.001f, 50.0f),
        uastcRDOMaxSmoothBlockErrorScale(
            ktxBasisParams::uastcRDOMaxSmoothBlockErrorScale,
            1.0f, 300.0f),
        uastcRDOMaxSmoothBlockStdDev(
            ktxBasisParams::uastcRDOMaxSmoothBlockStdDev,
            0.01f, 65536.0f) {
        threadCount = std::max<ktx_uint32_t>(1u, std::thread::hardware_concurrency());
        noSSE = false;
        structSize = sizeof(ktxBasisParams);
        // - 1 is to match what basisu_tool does (since 1.13).
        compressionLevel = KTX_ETC1S_DEFAULT_COMPRESSION_LEVEL - 1;
        qualityLevel.clear();
        maxEndpoints.clear();
        endpointRDOThreshold = 0.0f;
        maxSelectors.clear();
        selectorRDOThreshold = 0.0f;
        normalMap = false;
        separateRGToRGB_A = false;
        preSwizzle = false;
        noEndpointRDO = false;
        noSelectorRDO = false;
        uastc = false; // Default to ETC1S.
        uastcRDO = false;
        uastcFlags = KTX_PACK_UASTC_LEVEL_DEFAULT;
        uastcRDODictSize.clear();
        uastcRDOQualityScalar.clear();
        uastcRDODontFavorSimplerModes = false;
        uastcRDONoMultithreading = false;
        verbose = false; // Default to quiet operation.
        for (int i = 0; i < 4; i++) inputSwizzle[i] = 0;
    }